

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

Node * Alternate_append(Node *a,Node *e)

{
  Node *pNVar1;
  
  if (a == (Node *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0xbf,"Node *Alternate_append(Node *, Node *)");
  }
  pNVar1 = makeAlternate(a);
  if ((pNVar1->rule).variables != (Node *)0x0) {
    if (e != (Node *)0x0) {
      (((pNVar1->rule).variables)->rule).next = e;
      (pNVar1->rule).variables = e;
      return pNVar1;
    }
    __assert_fail("e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0xc2,"Node *Alternate_append(Node *, Node *)");
  }
  __assert_fail("a->alternate.last",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0xc1,"Node *Alternate_append(Node *, Node *)");
}

Assistant:

Node *Alternate_append(Node *a, Node *e)
{
  assert(a);
  a= makeAlternate(a);
  assert(a->alternate.last);
  assert(e);
  a->alternate.last->any.next= e;
  a->alternate.last= e;
  return a;
}